

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::SharedCtor
          (ImageFeatureType_ImageSizeRange *this)

{
  this->widthrange_ = (SizeRange *)0x0;
  this->heightrange_ = (SizeRange *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ImageFeatureType_ImageSizeRange::SharedCtor() {
  ::memset(&widthrange_, 0, reinterpret_cast<char*>(&heightrange_) -
    reinterpret_cast<char*>(&widthrange_) + sizeof(heightrange_));
  _cached_size_ = 0;
}